

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerRewriting.cpp
# Opt level: O0

bool __thiscall
Inferences::InnerRewriting::perform
          (InnerRewriting *this,Clause *cl,Clause **replacement,ClauseIterator *premises)

{
  Literal *pLVar1;
  TermList what;
  TermList what_00;
  bool bVar2;
  Literal **ppLVar3;
  Literal *pLVar4;
  Inference *this_00;
  Clause *pCVar5;
  undefined8 *in_RDX;
  Clause *in_RSI;
  Literal *rLit;
  Literal *oLit;
  uint k;
  RStack<Literal_*> resLits;
  Literal *nLit;
  Literal *lit;
  uint j;
  TermList rhs;
  TermList lhs;
  Literal *rwLit;
  uint i;
  uint len;
  Ordering *ordering;
  SimplifyingInference1 *in_stack_fffffffffffffea8;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffeb0;
  TermList in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  Literal *in_stack_fffffffffffffec8;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffef0;
  SimplifyingInference1 local_108 [2];
  Inference *in_stack_ffffffffffffff18;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff20;
  uint local_8c;
  uint local_54;
  TermList local_50;
  TermList local_48;
  Literal *local_40;
  uint local_38;
  uint local_34;
  Ordering *local_30;
  undefined8 *local_20;
  Clause *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x7f9fb8);
  local_34 = Kernel::Clause::length(local_18);
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    ppLVar3 = Kernel::Clause::operator[](local_18,local_38);
    local_40 = *ppLVar3;
    Kernel::TermList::TermList(&local_48);
    Kernel::TermList::TermList(&local_50);
    bVar2 = Kernel::Literal::isEquality((Literal *)0x7fa039);
    if (((bVar2) && (bVar2 = Kernel::Literal::isNegative((Literal *)0x7fa04f), bVar2)) &&
       (bVar2 = Kernel::EqHelper::hasGreaterEqualitySide
                          (in_stack_fffffffffffffec8,
                           (Ordering *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0)
                           ,(TermList *)in_stack_fffffffffffffeb8._content,
                           (TermList *)in_stack_fffffffffffffeb0), bVar2)) {
      for (local_54 = 0; local_54 < local_34; local_54 = local_54 + 1) {
        if (local_38 != local_54) {
          ppLVar3 = Kernel::Clause::operator[](local_18,local_54);
          pLVar1 = *ppLVar3;
          what._content._7_1_ = in_stack_fffffffffffffec7;
          what._content._0_7_ = in_stack_fffffffffffffec0;
          pLVar4 = Kernel::EqHelper::replace
                             ((Literal *)in_stack_fffffffffffffeb0,what,in_stack_fffffffffffffeb8);
          if (pLVar4 != pLVar1) {
            bVar2 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffffeb0);
            if (bVar2) {
              *(int *)(DAT_01333840 + 0x1a4) = *(int *)(DAT_01333840 + 0x1a4) + 1;
              local_1 = 1;
              goto LAB_007fa4a9;
            }
            Lib::
            Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)in_stack_fffffffffffffeb0);
            local_8c = 0;
            goto LAB_007fa185;
          }
        }
      }
    }
  }
  local_1 = 0;
  goto LAB_007fa4a9;
LAB_007fa185:
  if (local_34 <= local_8c) goto LAB_007fa395;
  if (local_8c == local_38) {
    in_stack_fffffffffffffef0 =
         Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
         operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)0x7fa1b6);
    Lib::Stack<Kernel::Literal_*>::push
              (in_stack_fffffffffffffeb0,(Literal *)in_stack_fffffffffffffea8);
  }
  else if (local_8c < local_54) {
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x7fa20c);
    Kernel::Clause::operator[](local_18,local_8c);
    Lib::Stack<Kernel::Literal_*>::push
              (in_stack_fffffffffffffeb0,(Literal *)in_stack_fffffffffffffea8);
  }
  else if (local_8c == local_54) {
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x7fa264);
    Lib::Stack<Kernel::Literal_*>::push
              (in_stack_fffffffffffffeb0,(Literal *)in_stack_fffffffffffffea8);
  }
  else {
    Kernel::Clause::operator[](local_18,local_8c);
    what_00._content._7_1_ = in_stack_fffffffffffffec7;
    what_00._content._0_7_ = in_stack_fffffffffffffec0;
    Kernel::EqHelper::replace
              ((Literal *)in_stack_fffffffffffffeb0,what_00,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffec7 =
         Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffffeb0);
    if ((bool)in_stack_fffffffffffffec7) {
      *(int *)(DAT_01333840 + 0x1a4) = *(int *)(DAT_01333840 + 0x1a4) + 1;
      goto LAB_007fa44f;
    }
    in_stack_fffffffffffffeb8._content =
         (uint64_t)
         Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
         operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)0x7fa35c);
    Lib::Stack<Kernel::Literal_*>::push
              (in_stack_fffffffffffffeb0,(Literal *)in_stack_fffffffffffffea8);
  }
  local_8c = local_8c + 1;
  goto LAB_007fa185;
LAB_007fa395:
  *(int *)(DAT_01333840 + 0x1a0) = *(int *)(DAT_01333840 + 0x1a0) + 1;
  this_00 = (Inference *)
            Lib::
            Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x7fa3bb);
  Kernel::SimplifyingInference1::SimplifyingInference1(local_108,INNER_REWRITING,local_18);
  Kernel::Inference::Inference(this_00,in_stack_fffffffffffffea8);
  pCVar5 = Kernel::Clause::fromStack(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *local_20 = pCVar5;
  Kernel::Inference::~Inference((Inference *)(local_108 + 1));
LAB_007fa44f:
  local_1 = 1;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            in_stack_fffffffffffffef0);
LAB_007fa4a9:
  return (bool)(local_1 & 1);
}

Assistant:

bool InnerRewriting::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  Ordering& ordering = _salg->getOrdering();

  // look for the first equality which rewrites something and rewrite everything with it (check for EqTaut as you go)
  unsigned len = cl->length();
  for (unsigned i = 0; i < len; i++) {
    Literal* rwLit=(*cl)[i];
    TermList lhs, rhs;
    if (rwLit->isEquality() && rwLit->isNegative() && EqHelper::hasGreaterEqualitySide(rwLit,ordering,lhs,rhs)) {
      for (unsigned j = 0; j < len; j++) {
        if (i != j) {
          Literal* lit = (*cl)[j];
          Literal* nLit = EqHelper::replace(lit,lhs,rhs);
          if (nLit != lit) {
            if(EqHelper::isEqTautology(nLit)) {
              env.statistics->innerRewritesToEqTaut++;
              return true;
            }

            RStack<Literal*> resLits;

            for (unsigned k = 0; k < len; k++) {
              if (k == i) {
                resLits->push(rwLit);
              } else if (k < j) {
                resLits->push((*cl)[k]);
              } else if (k == j) {
                resLits->push(nLit);
              } else {
                Literal* oLit = (*cl)[k];
                Literal* rLit = EqHelper::replace(oLit,lhs,rhs);
                if(EqHelper::isEqTautology(rLit)) {
                  env.statistics->innerRewritesToEqTaut++;
                  return true;
                }
                resLits->push(rLit);
              }
            }

            env.statistics->innerRewrites++;

            replacement = Clause::fromStack(*resLits,SimplifyingInference1(InferenceRule::INNER_REWRITING, cl));
            return true;
          }
        }
      }
    }
  }

  return false;
}